

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O3

void cilk_fiber_tbb_interop_use_saved_stack_op_info(cilk_fiber *fiber)

{
  void *pvVar1;
  __cilk_tbb_stack_op_thunk *p_Var2;
  cilk_fiber_data *fdata;
  
  p_Var2 = __cilkrts_get_tls_tbb_interop();
  if (fiber == (cilk_fiber *)0x0) {
    cilk_fiber_tbb_interop_use_saved_stack_op_info_cold_1();
  }
  if (p_Var2 != (__cilk_tbb_stack_op_thunk *)0x0) {
    pvVar1 = p_Var2->data;
    (fiber->super_cilk_fiber_data).stack_op_routine = p_Var2->routine;
    (fiber->super_cilk_fiber_data).stack_op_data = pvVar1;
    cilk_fiber_tbb_interop_free_stack_op_info();
    return;
  }
  return;
}

Assistant:

void cilk_fiber_tbb_interop_use_saved_stack_op_info(cilk_fiber* fiber)
{
    __cilk_tbb_stack_op_thunk *saved_thunk =
        __cilkrts_get_tls_tbb_interop();

    CILK_ASSERT(fiber);
    // If we haven't allocated a TBB interop index, we don't have any saved info
    if (NULL == saved_thunk) {
        DBG_STACK_OPS ("cilk_fiber %p: tbb_interop_use_saved_stack_op_info - no saved info\n",
                       fiber);
        return;
    }

    DBG_STACK_OPS ("cilk_fiber %p: tbb_interop_use_saved_stack_op_info - using saved info\n",
                   fiber);

     // Associate the saved info with the __cilkrts_stack
    cilk_fiber_set_stack_op(fiber, *saved_thunk);
    
    // Free the saved data.  We'll save it again if needed when the code
    // returns from the initial function
    cilk_fiber_tbb_interop_free_stack_op_info();
}